

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O0

void __thiscall ninx::lexer::Reader::ignore_spaces_and_newline(Reader *this,int newline_limit)

{
  int iVar1;
  int iVar2;
  bool local_2a;
  int local_18;
  int current;
  int newline_count;
  int newline_limit_local;
  Reader *this_local;
  
  local_18 = 0;
  while( true ) {
    iVar1 = std::istream::peek();
    iVar2 = isspace(iVar1);
    local_2a = false;
    if (iVar2 != 0) {
      local_2a = local_18 < newline_limit || newline_limit < 0;
    }
    if (!local_2a) break;
    std::istream::get();
    if (iVar1 == 10) {
      local_18 = local_18 + 1;
    }
  }
  return;
}

Assistant:

void ninx::lexer::Reader::ignore_spaces_and_newline(int newline_limit) {
    int newline_count = 0;
    int current;
    while (isspace(current = this->stream.peek()) && (newline_count < newline_limit || newline_limit <0)) {
        this->stream.get();
        if (current == '\n') {
            newline_count++;
        }
    }
}